

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O1

CloudNode * Kit_TruthToCloud_rec(CloudManager *dd,uint *pTruth,int nVars,int nVarsAll)

{
  long lVar1;
  long lVar2;
  CloudNode *pCVar3;
  CloudNode *t;
  int iVar4;
  uint uVar6;
  ulong uVar7;
  int nVars_00;
  ulong uVar5;
  
LAB_0054e36c:
  do {
    nVars_00 = nVars;
    if (nVars_00 < 6) {
      pCVar3 = Kit_TruthToCloud5_rec(dd,*pTruth,nVars_00,nVarsAll);
      return pCVar3;
    }
    uVar7 = (ulong)(uint)(1 << ((char)nVars_00 - 5U & 0x1f));
    uVar5 = uVar7;
    do {
      iVar4 = (int)uVar5;
      if (iVar4 < 1) goto LAB_0054e446;
      lVar1 = uVar5 - 1;
      uVar5 = uVar5 - 1;
    } while (pTruth[lVar1] == 0);
    if (iVar4 < 1) {
LAB_0054e446:
      return dd->zero;
    }
    do {
      iVar4 = (int)uVar7;
      if (iVar4 < 1) goto LAB_0054e44c;
      lVar1 = uVar7 - 1;
      uVar7 = uVar7 - 1;
    } while (pTruth[lVar1] == 0xffffffff);
    if (iVar4 < 1) {
LAB_0054e44c:
      return dd->one;
    }
    nVars = nVars_00 + -1;
    uVar6 = 1 << ((char)nVars_00 - 6U & 0x1f);
    uVar7 = (ulong)uVar6;
    uVar5 = uVar7;
    do {
      iVar4 = (int)uVar5;
      if (iVar4 < 1) goto LAB_0054e36c;
      lVar1 = uVar5 - 1;
      lVar2 = uVar5 - 1;
      uVar5 = uVar5 - 1;
    } while (pTruth[lVar1] == pTruth[(int)uVar6 + lVar2]);
  } while (iVar4 < 1);
  do {
    iVar4 = (int)uVar7;
    if (iVar4 < 1) goto LAB_0054e47c;
    lVar1 = uVar7 - 1;
    lVar2 = uVar7 - 1;
    uVar7 = uVar7 - 1;
  } while ((pTruth[(int)uVar6 + lVar1] ^ pTruth[lVar2]) == 0xffffffff);
  if (iVar4 < 1) {
LAB_0054e47c:
    pCVar3 = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVarsAll);
    t = (CloudNode *)((ulong)pCVar3 ^ 1);
  }
  else {
    pCVar3 = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVarsAll);
    t = Kit_TruthToCloud_rec(dd,pTruth + (int)uVar6,nVars,nVarsAll);
  }
  pCVar3 = Cloud_MakeNode(dd,nVarsAll - nVars_00,t,pCVar3);
  return pCVar3;
}

Assistant:

CloudNode * Kit_TruthToCloud_rec( CloudManager * dd, unsigned * pTruth, int nVars, int nVarsAll )
{
    CloudNode * pCof0, * pCof1;
    unsigned * pTruth0, * pTruth1;
    if ( nVars <= 5 )
        return Kit_TruthToCloud5_rec( dd, pTruth[0], nVars, nVarsAll );
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return dd->zero;
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return dd->one;
//    Count++;
    pTruth0 = pTruth;
    pTruth1 = pTruth + Kit_TruthWordNum(nVars-1);
    if ( Kit_TruthIsEqual( pTruth0, pTruth1, nVars - 1 ) )
        return Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
    if ( Kit_TruthIsOpposite( pTruth0, pTruth1, nVars - 1 ) )
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud_rec( dd, pTruth0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud_rec( dd, pTruth1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}